

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O0

void __thiscall cppjieba::HMMModel::LoadModel(HMMModel *this,string *filePath)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined8 uVar5;
  ostream *poVar6;
  size_type sVar7;
  char *pcVar8;
  string *in_RSI;
  long in_RDI;
  double dVar9;
  size_t j_1;
  size_t i;
  size_t j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  string line;
  ifstream ifile;
  undefined7 in_stack_ffffffffffffe8b0;
  undefined7 in_stack_ffffffffffffe8d0;
  undefined1 in_stack_ffffffffffffe8d7;
  ostream *in_stack_ffffffffffffe8e8;
  undefined7 in_stack_ffffffffffffe8f0;
  undefined1 in_stack_ffffffffffffe8f7;
  HMMModel *in_stack_ffffffffffffe8f8;
  ostream *in_stack_ffffffffffffe928;
  int lineno;
  undefined7 in_stack_ffffffffffffe930;
  undefined1 in_stack_ffffffffffffe937;
  size_t in_stack_ffffffffffffe938;
  ulong level;
  Logger *in_stack_ffffffffffffe940;
  allocator *res;
  ostream *in_stack_ffffffffffffe950;
  Logger local_1660;
  Logger local_14e0;
  EmitProbMap *in_stack_ffffffffffffecd8;
  string *in_stack_ffffffffffffece0;
  HMMModel *in_stack_ffffffffffffece8;
  Logger local_11e0;
  Logger local_1060;
  Logger local_ee0;
  Logger local_d60;
  Logger local_be0;
  ulong local_a60;
  Logger local_a58;
  allocator local_8d1;
  string local_8d0 [32];
  Logger local_8b0;
  ulong local_730;
  ulong local_728;
  Logger local_720;
  allocator local_599;
  string local_598 [32];
  Logger local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  string local_3c8 [32];
  Logger local_3a8;
  undefined1 local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  uVar5 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,uVar5,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),
               (int)((ulong)in_stack_ffffffffffffe928 >> 0x20));
    poVar6 = limonp::Logger::Stream(&local_3a8);
    poVar6 = std::operator<<(poVar6,"exp: [ifile.is_open()");
    poVar6 = std::operator<<(poVar6,"] false. ");
    poVar6 = std::operator<<(poVar6,"open ");
    poVar6 = std::operator<<(poVar6,local_10);
    std::operator<<(poVar6," failed");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0))
    ;
  }
  std::__cxx11::string::string(local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x15cb7f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x15cb8c);
  bVar2 = GetLine(in_stack_ffffffffffffe8f8,
                  (ifstream *)CONCAT17(in_stack_ffffffffffffe8f7,in_stack_ffffffffffffe8f0),
                  (string *)in_stack_ffffffffffffe8e8);
  if (!bVar2) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),
               (int)((ulong)in_stack_ffffffffffffe928 >> 0x20));
    poVar6 = limonp::Logger::Stream(&local_578);
    in_stack_ffffffffffffe950 = std::operator<<(poVar6,"exp: [GetLine(ifile, line)");
    std::operator<<(in_stack_ffffffffffffe950,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0))
    ;
  }
  res = &local_599;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598," ",res);
  limonp::Split((string *)in_stack_ffffffffffffe950,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)res,(string *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_3e0);
  if (sVar7 != 4) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),
               (int)((ulong)in_stack_ffffffffffffe928 >> 0x20));
    poVar6 = limonp::Logger::Stream(&local_720);
    in_stack_ffffffffffffe940 = (Logger *)std::operator<<(poVar6,"exp: [tmp.size() == STATUS_SUM");
    std::operator<<((ostream *)in_stack_ffffffffffffe940,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0))
    ;
  }
  local_728 = 0;
  while( true ) {
    level = local_728;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_3e0);
    if (sVar7 <= level) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_3e0,local_728);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    dVar9 = atof(pcVar8);
    *(double *)(in_RDI + 8 + local_728 * 8) = dVar9;
    local_728 = local_728 + 1;
  }
  for (local_730 = 0; lineno = (int)((ulong)in_stack_ffffffffffffe928 >> 0x20), local_730 < 4;
      local_730 = local_730 + 1) {
    in_stack_ffffffffffffe937 =
         GetLine(in_stack_ffffffffffffe8f8,
                 (ifstream *)CONCAT17(in_stack_ffffffffffffe8f7,in_stack_ffffffffffffe8f0),
                 (string *)in_stack_ffffffffffffe8e8);
    if (!(bool)in_stack_ffffffffffffe937) {
      limonp::Logger::Logger
                (in_stack_ffffffffffffe940,level,
                 (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),
                 (int)((ulong)in_stack_ffffffffffffe928 >> 0x20));
      poVar6 = limonp::Logger::Stream(&local_8b0);
      in_stack_ffffffffffffe928 = std::operator<<(poVar6,"exp: [GetLine(ifile, line)");
      std::operator<<(in_stack_ffffffffffffe928,"] false. ");
      limonp::Logger::~Logger
                ((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d0," ",&local_8d1);
    limonp::Split((string *)in_stack_ffffffffffffe950,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)res,(string *)in_stack_ffffffffffffe940,level);
    std::__cxx11::string::~string(local_8d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_3e0);
    if (sVar7 != 4) {
      limonp::Logger::Logger
                (in_stack_ffffffffffffe940,level,
                 (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),
                 (int)((ulong)in_stack_ffffffffffffe928 >> 0x20));
      poVar6 = limonp::Logger::Stream(&local_a58);
      poVar6 = std::operator<<(poVar6,"exp: [tmp.size() == STATUS_SUM");
      std::operator<<(poVar6,"] false. ");
      limonp::Logger::~Logger
                ((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0));
    }
    for (local_a60 = 0; local_a60 < 4; local_a60 = local_a60 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_3e0,local_a60);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      dVar9 = atof(pcVar8);
      *(double *)(in_RDI + 0x28 + local_730 * 0x20 + local_a60 * 8) = dVar9;
    }
  }
  bVar2 = GetLine(in_stack_ffffffffffffe8f8,
                  (ifstream *)CONCAT17(in_stack_ffffffffffffe8f7,in_stack_ffffffffffffe8f0),
                  (string *)in_stack_ffffffffffffe8e8);
  if (!bVar2) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream(&local_be0);
    poVar6 = std::operator<<(poVar6,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar6,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0))
    ;
  }
  bVar2 = LoadEmitProb(in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8
                      );
  if (!bVar2) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream(&local_d60);
    in_stack_ffffffffffffe8f8 =
         (HMMModel *)std::operator<<(poVar6,"exp: [LoadEmitProb(line, emitProbB)");
    std::operator<<((ostream *)in_stack_ffffffffffffe8f8,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0))
    ;
  }
  uVar3 = GetLine(in_stack_ffffffffffffe8f8,
                  (ifstream *)CONCAT17(in_stack_ffffffffffffe8f7,in_stack_ffffffffffffe8f0),
                  (string *)in_stack_ffffffffffffe8e8);
  if (!(bool)uVar3) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream(&local_ee0);
    in_stack_ffffffffffffe8e8 = std::operator<<(poVar6,"exp: [GetLine(ifile, line)");
    std::operator<<(in_stack_ffffffffffffe8e8,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0))
    ;
  }
  bVar2 = LoadEmitProb(in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8
                      );
  if (!bVar2) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream(&local_1060);
    poVar6 = std::operator<<(poVar6,"exp: [LoadEmitProb(line, emitProbE)");
    std::operator<<(poVar6,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0))
    ;
  }
  uVar4 = GetLine(in_stack_ffffffffffffe8f8,(ifstream *)CONCAT17(uVar3,in_stack_ffffffffffffe8f0),
                  (string *)in_stack_ffffffffffffe8e8);
  if (!(bool)uVar4) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream(&local_11e0);
    poVar6 = std::operator<<(poVar6,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar6,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(uVar4,in_stack_ffffffffffffe8d0));
  }
  bVar2 = LoadEmitProb(in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8
                      );
  if (!bVar2) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream((Logger *)&stack0xffffffffffffeca0);
    poVar6 = std::operator<<(poVar6,"exp: [LoadEmitProb(line, emitProbM)");
    std::operator<<(poVar6,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(uVar4,in_stack_ffffffffffffe8d0));
  }
  uVar3 = GetLine(in_stack_ffffffffffffe8f8,(ifstream *)CONCAT17(uVar3,in_stack_ffffffffffffe8f0),
                  (string *)in_stack_ffffffffffffe8e8);
  if (!(bool)uVar3) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream(&local_14e0);
    poVar6 = std::operator<<(poVar6,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar6,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(uVar4,in_stack_ffffffffffffe8d0));
  }
  bVar2 = LoadEmitProb(in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8
                      );
  if (!bVar2) {
    limonp::Logger::Logger
              (in_stack_ffffffffffffe940,level,
               (char *)CONCAT17(in_stack_ffffffffffffe937,in_stack_ffffffffffffe930),lineno);
    poVar6 = limonp::Logger::Stream(&local_1660);
    poVar6 = std::operator<<(poVar6,"exp: [LoadEmitProb(line, emitProbS)");
    std::operator<<(poVar6,"] false. ");
    limonp::Logger::~Logger((Logger *)CONCAT17(uVar4,in_stack_ffffffffffffe8d0));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(uVar3,in_stack_ffffffffffffe8b0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(uVar3,in_stack_ffffffffffffe8b0));
  std::__cxx11::string::~string(local_3c8);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void LoadModel(const string& filePath) {
    ifstream ifile(filePath.c_str());
    XCHECK(ifile.is_open()) << "open " << filePath << " failed";
    string line;
    vector<string> tmp;
    vector<string> tmp2;
    //Load startProb
    XCHECK(GetLine(ifile, line));
    Split(line, tmp, " ");
    XCHECK(tmp.size() == STATUS_SUM);
    for (size_t j = 0; j< tmp.size(); j++) {
      startProb[j] = atof(tmp[j].c_str());
    }

    //Load transProb
    for (size_t i = 0; i < STATUS_SUM; i++) {
      XCHECK(GetLine(ifile, line));
      Split(line, tmp, " ");
      XCHECK(tmp.size() == STATUS_SUM);
      for (size_t j =0; j < STATUS_SUM; j++) {
        transProb[i][j] = atof(tmp[j].c_str());
      }
    }

    //Load emitProbB
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbB));

    //Load emitProbE
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbE));

    //Load emitProbM
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbM));

    //Load emitProbS
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbS));
  }